

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_PlatformSetImeData
               (ImGuiContext *param_1,ImGuiViewport *param_2,ImGuiPlatformImeData *data)

{
  byte *in_RDX;
  SDL_Rect r;
  int local_28;
  int local_24;
  undefined4 local_20;
  int local_1c;
  
  if ((*in_RDX & 1) != 0) {
    local_28 = (int)*(float *)(in_RDX + 4);
    local_24 = (int)*(float *)(in_RDX + 8);
    local_20 = 1;
    local_1c = (int)*(float *)(in_RDX + 0xc);
    SDL_SetTextInputRect(&local_28);
  }
  return;
}

Assistant:

static void ImGui_ImplSDL2_PlatformSetImeData(ImGuiContext*, ImGuiViewport*, ImGuiPlatformImeData* data)
{
    if (data->WantVisible)
    {
        SDL_Rect r;
        r.x = (int)data->InputPos.x;
        r.y = (int)data->InputPos.y;
        r.w = 1;
        r.h = (int)data->InputLineHeight;
        SDL_SetTextInputRect(&r);
    }
}